

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

void __thiscall
ctemplate::TemplateDictionary::SetTemplateGlobalValue
          (TemplateDictionary *this,TemplateString variable,TemplateString value)

{
  TemplateDictionary *parent_dict;
  BaseArena *this_00;
  TemplateDictionary *this_01;
  TemplateString local_50;
  
  parent_dict = this->template_global_dict_owner_;
  if (parent_dict != (TemplateDictionary *)0x0) {
    if (parent_dict->template_global_dict_ == (TemplateDictionary *)0x0) {
      local_50.ptr_ = "Template Globals";
      local_50.length_ = 0x10;
      local_50.is_immutable_ = false;
      local_50.id_ = 0;
      this_00 = &this->arena_->super_BaseArena;
      this_01 = (TemplateDictionary *)BaseArena::GetMemory(this_00,0x70,8);
      TemplateDictionary(this_01,&local_50,(UnsafeArena *)this_00,parent_dict,parent_dict);
      this->template_global_dict_owner_->template_global_dict_ = this_01;
    }
    SetValue(this->template_global_dict_owner_->template_global_dict_,variable,value);
    return;
  }
  __assert_fail("template_global_dict_owner_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                ,0x1f8,
                "void ctemplate::TemplateDictionary::SetTemplateGlobalValue(const TemplateString, const TemplateString)"
               );
}

Assistant:

void TemplateDictionary::SetTemplateGlobalValue(const TemplateString variable,
                                                const TemplateString value) {
  assert(template_global_dict_owner_ != NULL);
  LazyCreateTemplateGlobalDict();
  template_global_dict_owner_->template_global_dict_->SetValue(variable, value);
}